

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlDtdPtr xmlCtxtParseDtd(xmlParserCtxtPtr ctxt,xmlParserInputPtr input,xmlChar *publicId,
                         xmlChar *systemId)

{
  int iVar1;
  xmlDocPtr doc;
  xmlDtdPtr pxVar2;
  _xmlNode *p_Var3;
  
  if (ctxt == (xmlParserCtxtPtr)0x0 || input == (xmlParserInputPtr)0x0) {
    pxVar2 = (xmlDtdPtr)0x0;
    xmlFatalErr(ctxt,XML_ERR_ARGUMENT,(char *)0x0);
    goto LAB_0013c962;
  }
  iVar1 = xmlCtxtPushInput(ctxt,input);
  if (iVar1 < 0) {
    pxVar2 = (xmlDtdPtr)0x0;
    goto LAB_0013c962;
  }
  if (publicId == (xmlChar *)0x0) {
    publicId = (xmlChar *)"none";
  }
  if (systemId == (xmlChar *)0x0) {
    systemId = (xmlChar *)"none";
  }
  doc = xmlNewDoc("1.0");
  ctxt->myDoc = doc;
  if (doc == (xmlDocPtr)0x0) {
    xmlCtxtErrMemory(ctxt);
LAB_0013c954:
    pxVar2 = (xmlDtdPtr)0x0;
  }
  else {
    doc->properties = 0x40;
    pxVar2 = xmlNewDtd(doc,(xmlChar *)"none",publicId,systemId);
    ctxt->myDoc->extSubset = pxVar2;
    if (pxVar2 == (xmlDtdPtr)0x0) {
      xmlCtxtErrMemory(ctxt);
      xmlFreeDoc(ctxt->myDoc);
      goto LAB_0013c954;
    }
    xmlParseExternalSubset(ctxt,publicId,systemId);
    if (ctxt->wellFormed == 0) {
LAB_0013c930:
      pxVar2 = (xmlDtdPtr)0x0;
    }
    else {
      pxVar2 = ctxt->myDoc->extSubset;
      ctxt->myDoc->extSubset = (_xmlDtd *)0x0;
      if (pxVar2 == (xmlDtdPtr)0x0) goto LAB_0013c930;
      pxVar2->doc = (_xmlDoc *)0x0;
      for (p_Var3 = pxVar2->children; p_Var3 != (_xmlNode *)0x0; p_Var3 = p_Var3->next) {
        p_Var3->doc = (_xmlDoc *)0x0;
      }
    }
    xmlFreeDoc(ctxt->myDoc);
    ctxt->myDoc = (xmlDocPtr)0x0;
  }
  input = xmlCtxtPopInput(ctxt);
LAB_0013c962:
  xmlFreeInputStream(input);
  return pxVar2;
}

Assistant:

xmlDtdPtr
xmlCtxtParseDtd(xmlParserCtxtPtr ctxt, xmlParserInputPtr input,
                const xmlChar *publicId, const xmlChar *systemId) {
    xmlDtdPtr ret = NULL;

    if ((ctxt == NULL) || (input == NULL)) {
        xmlFatalErr(ctxt, XML_ERR_ARGUMENT, NULL);
        xmlFreeInputStream(input);
        return(NULL);
    }

    if (xmlCtxtPushInput(ctxt, input) < 0) {
        xmlFreeInputStream(input);
        return(NULL);
    }

    if (publicId == NULL)
        publicId = BAD_CAST "none";
    if (systemId == NULL)
        systemId = BAD_CAST "none";

    ctxt->myDoc = xmlNewDoc(BAD_CAST "1.0");
    if (ctxt->myDoc == NULL) {
        xmlErrMemory(ctxt);
        goto error;
    }
    ctxt->myDoc->properties = XML_DOC_INTERNAL;
    ctxt->myDoc->extSubset = xmlNewDtd(ctxt->myDoc, BAD_CAST "none",
                                       publicId, systemId);
    if (ctxt->myDoc->extSubset == NULL) {
        xmlErrMemory(ctxt);
        xmlFreeDoc(ctxt->myDoc);
        goto error;
    }

    xmlParseExternalSubset(ctxt, publicId, systemId);

    if (ctxt->wellFormed) {
        ret = ctxt->myDoc->extSubset;
        ctxt->myDoc->extSubset = NULL;
        if (ret != NULL) {
            xmlNodePtr tmp;

            ret->doc = NULL;
            tmp = ret->children;
            while (tmp != NULL) {
                tmp->doc = NULL;
                tmp = tmp->next;
            }
        }
    } else {
        ret = NULL;
    }
    xmlFreeDoc(ctxt->myDoc);
    ctxt->myDoc = NULL;

error:
    xmlFreeInputStream(xmlCtxtPopInput(ctxt));

    return(ret);
}